

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::logPrepare
          (SubmitCommandBuffer *this,TestLog *log,size_t commandIndex)

{
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  const_reference ppCVar3;
  ulong local_a0;
  size_t cmdNdx;
  ScopedLogSection section;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string sectionName;
  size_t commandIndex_local;
  TestLog *log_local;
  SubmitCommandBuffer *this_local;
  
  sectionName.field_2._8_8_ = commandIndex;
  de::toString<unsigned_long>(&local_80,(unsigned_long *)(sectionName.field_2._M_local_buf + 8));
  std::operator+(&local_60,&local_80,":");
  iVar1 = (*(this->super_Command)._vptr_Command[2])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,(char *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&cmdNdx,log,(string *)local_40,(string *)local_40);
  local_a0 = 0;
  while( true ) {
    sVar2 = std::
            vector<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
            ::size(&this->m_commands);
    if (sVar2 <= local_a0) break;
    ppCVar3 = std::
              vector<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
              ::operator[](&this->m_commands,local_a0);
    (*(*ppCVar3)->_vptr_CmdCommand[3])(*ppCVar3,log,local_a0);
    local_a0 = local_a0 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&cmdNdx);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void SubmitCommandBuffer::logPrepare (TestLog& log, size_t commandIndex) const
{
	const string				sectionName	(de::toString(commandIndex) + ":" + getName());
	const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
		m_commands[cmdNdx]->logPrepare(log, cmdNdx);
}